

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O1

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateAttribute
          (HtmlparserCppTest *this,string *expected_attr)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  _Base_ptr __n;
  bool bVar2;
  int iVar3;
  long lVar4;
  _Base_ptr p_Var5;
  _Alloc_hider _Var6;
  HtmlparserCppTest *pHVar7;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *extraout_RAX;
  _Base_ptr this_00;
  char *extraout_RAX_00;
  char *extraout_RAX_01;
  int *piVar8;
  HtmlParser *this_01;
  const_iterator cVar9;
  mapped_type *ppHVar10;
  undefined8 extraout_RAX_02;
  undefined7 uVar11;
  ulong uVar12;
  htmlparser_ctx *phVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  HtmlparserCppTest *pHVar16;
  _Base_ptr p_Var17;
  htmlparser_ctx_s *phVar18;
  pointer this_02;
  _Base_ptr unaff_R12;
  pointer str_00;
  _Base_ptr unaff_R15;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_1f8;
  _Base_ptr p_Stack_1e0;
  _Base_ptr p_Stack_1d8;
  undefined1 auStack_198 [16];
  _Base_ptr p_Stack_188;
  _Base_ptr p_Stack_180;
  _Base_ptr p_Stack_178;
  undefined1 auStack_170 [16];
  _Base_ptr p_Stack_160;
  _Base_ptr p_Stack_158;
  _Base_ptr p_Stack_150;
  char *pcStack_148;
  HtmlParser HStack_140;
  allocator aStack_101;
  HtmlparserCppTest *pHStack_100;
  _Base_ptr p_Stack_f8;
  HtmlparserCppTest HStack_f0;
  HtmlparserCppTest *pHStack_b0;
  ulong uStack_a8;
  _Base_ptr p_Stack_98;
  allocator aStack_81;
  _Alloc_hider _Stack_80;
  _Base_ptr p_Stack_78;
  undefined1 auStack_70 [40];
  _Alloc_hider _Stack_48;
  HtmlParser HStack_40;
  undefined1 auStack_38 [40];
  
  this_00 = (_Base_ptr)(this->parser_).parser_;
  auStack_38._24_8_ = 0x107011;
  p_Var5 = (_Base_ptr)expected_attr;
  lVar4 = ctemplate_htmlparser::htmlparser_attr((htmlparser_ctx_s *)this_00);
  if (lVar4 == 0) {
    auStack_38._24_8_ = 0x10703b;
    ValidateAttribute();
  }
  else {
    auStack_38._24_8_ = 0x10701f;
    p_Var5 = (_Base_ptr)ctemplate_htmlparser::htmlparser_attr((this->parser_).parser_);
    auStack_38._24_8_ = 0x10702a;
    this_00 = (_Base_ptr)expected_attr;
    iVar3 = std::__cxx11::string::compare((char *)expected_attr);
    if (iVar3 == 0) {
      return;
    }
  }
  auStack_38._24_8_ = ValidateValue;
  ValidateAttribute();
  p_Var17 = (_Base_ptr)
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&this_00[1]._M_left)->_M_allocated_capacity;
  auStack_70._24_8_ = (_Base_ptr)0x107056;
  _Var6._M_p = (pointer)p_Var5;
  auStack_38._16_8_ = expected_attr;
  auStack_38._24_8_ = this;
  lVar4 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)p_Var17);
  if (lVar4 != 0) {
    auStack_70._24_8_ = (_Base_ptr)0x107064;
    _Var6._M_p = (pointer)ctemplate_htmlparser::htmlparser_value
                                    ((htmlparser_ctx_s *)
                                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)&this_00[1]._M_left)->_M_allocated_capacity);
    this_00 = (_Base_ptr)&_Stack_48;
    auStack_70._24_8_ = (_Base_ptr)0x107079;
    p_Var17 = this_00;
    std::__cxx11::string::string((string *)this_00,_Var6._M_p,(allocator *)(auStack_70 + 0x27));
    __n = p_Var5->_M_parent;
    if (__n == (_Base_ptr)HStack_40.parser_) {
      if (__n == (_Base_ptr)0x0) {
LAB_00107099:
        if ((string *)_Stack_48._M_p != (string *)auStack_38) {
          auStack_70._24_8_ = (_Base_ptr)0x1070ac;
          operator_delete(_Stack_48._M_p);
        }
        return;
      }
      p_Var17 = *(_Base_ptr *)p_Var5;
      auStack_70._24_8_ = (_Base_ptr)0x107095;
      _Var6._M_p = _Stack_48._M_p;
      iVar3 = bcmp(p_Var17,_Stack_48._M_p,(size_t)__n);
      if (iVar3 == 0) goto LAB_00107099;
    }
    auStack_70._24_8_ = (_Base_ptr)0x1070b9;
    ValidateValue();
  }
  auStack_70._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_70._24_8_ = this_00;
  auStack_70._16_8_ = p_Var5;
  pHVar16 = *(HtmlparserCppTest **)&p_Var17[1]._M_left;
  iVar3 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar16);
  puVar14 = kAttributeTypeMap;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar16,(IdNameMap *)kAttributeTypeMap,iVar3);
  if (((_Base_ptr)_Var6._M_p)->_M_parent == (_Base_ptr)0x0) {
    ValidateAttributeType();
  }
  else {
    this_00 = (_Base_ptr)&_Stack_80;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar7,&aStack_81);
    p_Var5 = ((_Base_ptr)_Var6._M_p)->_M_parent;
    puVar14 = (undefined1 *)pHVar7;
    if (p_Var5 == p_Stack_78) {
      uVar11 = (undefined7)((ulong)_Var6._M_p >> 8);
      if (p_Var5 == (_Base_ptr)0x0) {
        _Var6._M_p = (pointer)CONCAT71(uVar11,1);
      }
      else {
        puVar14 = _Stack_80._M_p;
        iVar3 = bcmp(*(void **)_Var6._M_p,_Stack_80._M_p,(size_t)p_Var5);
        _Var6._M_p = (pointer)CONCAT71(uVar11,iVar3 == 0);
      }
    }
    else {
      _Var6._M_p = (pointer)0x0;
    }
    if ((HtmlparserCppTest *)_Stack_80._M_p != (HtmlparserCppTest *)auStack_70) {
      operator_delete(_Stack_80._M_p);
    }
    pHVar16 = (HtmlparserCppTest *)_Stack_80._M_p;
    if ((char)_Var6._M_p != '\0') {
      return;
    }
  }
  ValidateAttributeType();
  uStack_a8 = 0x10715c;
  p_Stack_98 = (_Base_ptr)_Var6._M_p;
  bVar2 = StringToBool((string *)puVar14);
  uVar12 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
  phVar18 = (pHVar16->parser_).parser_;
  uStack_a8 = 0x107167;
  iVar3 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar18);
  if (SUB81(uVar12,0) == (iVar3 != 0)) {
    return;
  }
  uStack_a8 = 0x10717d;
  ValidateAttributeQuoted();
  HStack_f0.parser_.parser_ = (htmlparser_ctx *)0x10718c;
  pHStack_b0 = pHVar16;
  uStack_a8 = uVar12;
  bVar2 = StringToBool((string *)puVar14);
  phVar13 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar2) & 0xffffffff);
  p_Var5 = *(_Base_ptr *)(phVar18 + 0x30);
  HStack_f0.parser_.parser_ = (htmlparser_ctx *)0x107197;
  iVar3 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var5);
  if (SUB81(phVar13,0) == (iVar3 != 0)) {
    return;
  }
  HStack_f0.parser_.parser_ = (htmlparser_ctx *)0x1071ad;
  ValidateInJavascript();
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071bc;
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar18;
  HStack_f0.parser_.parser_ = phVar13;
  bVar2 = StringToBool((string *)puVar14);
  p_Var17 = p_Var5[1]._M_left;
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071c7;
  iVar3 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var17);
  if (bVar2 == (iVar3 != 0)) {
    return;
  }
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071dd;
  ValidateJavascriptQuoted();
  pHVar16 = (HtmlparserCppTest *)p_Var17[1]._M_left;
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var5;
  HStack_f0.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = this_00;
  iVar3 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar16);
  puVar15 = kJavascriptStateMap;
  pHVar7 = (HtmlparserCppTest *)IdToName(pHVar16,(IdNameMap *)kJavascriptStateMap,iVar3);
  if (*(long *)&(((HtmlparserCppTest *)puVar14)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    this_00 = (_Base_ptr)&pHStack_100;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar7,&aStack_101);
    p_Var5 = *(_Base_ptr *)
              &(((HtmlparserCppTest *)puVar14)->contextMap)._M_t._M_impl.super__Rb_tree_header.
               _M_header;
    puVar15 = (undefined1 *)pHVar7;
    if (p_Var5 == p_Stack_f8) {
      if (p_Var5 == (_Base_ptr)0x0) {
        bVar2 = true;
      }
      else {
        puVar15 = (undefined1 *)pHStack_100;
        iVar3 = bcmp(*(pointer *)&(((HtmlparserCppTest *)puVar14)->contextMap)._M_t._M_impl,
                     pHStack_100,(size_t)p_Var5);
        bVar2 = iVar3 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (pHStack_100 != &HStack_f0) {
      operator_delete(pHStack_100);
    }
    pHVar16 = pHStack_100;
    if (bVar2) {
      return;
    }
  }
  ValidateJavascriptState();
  bVar2 = StringToBool((string *)puVar15);
  p_Var5 = (_Base_ptr)(pHVar16->parser_).parser_;
  iVar3 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)p_Var5);
  if (bVar2 == (iVar3 != 0)) {
    return;
  }
  ValidateInCss();
  pHVar7 = (HtmlparserCppTest *)&pcStack_148;
  HStack_140.parser_ = (htmlparser_ctx *)pHVar16;
  if (*(long *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar2 = false;
    p_Var17 = p_Var5;
  }
  else {
    p_Stack_150 = (_Base_ptr)0x1072b8;
    pcStack_148 = extraout_RAX;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var17 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl;
    p_Stack_150 = (_Base_ptr)0x1072d4;
    this_00 = (_Base_ptr)strtol((char *)p_Var17,&pcStack_148,10);
    puVar15 = (undefined1 *)pHVar7;
    if (*pcStack_148 == '\0') {
      bVar2 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)&pcStack_148;
    }
    else {
      bVar2 = false;
      unaff_R12 = (_Base_ptr)&pcStack_148;
    }
  }
  if (bVar2) {
    p_Var17 = p_Var5[1]._M_left;
    p_Stack_150 = (_Base_ptr)0x1072fc;
    iVar3 = ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)p_Var17);
    if ((int)this_00 == iVar3) {
      return;
    }
  }
  else {
    p_Stack_150 = (_Base_ptr)0x107312;
    ValidateLine();
  }
  p_Stack_150 = (_Base_ptr)0x107317;
  ValidateLine();
  pHVar16 = (HtmlparserCppTest *)auStack_170;
  auStack_170._8_8_ = p_Var5;
  p_Stack_160 = unaff_R12;
  p_Stack_158 = this_00;
  p_Stack_150 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar2 = false;
    p_Var5 = p_Var17;
  }
  else {
    p_Stack_178 = (_Base_ptr)0x107332;
    auStack_170._0_8_ = extraout_RAX_00;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var5 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl;
    p_Stack_178 = (_Base_ptr)0x10734e;
    this_00 = (_Base_ptr)strtol((char *)p_Var5,(char **)auStack_170,10);
    puVar15 = (undefined1 *)pHVar16;
    if (*(char *)auStack_170._0_8_ == '\0') {
      bVar2 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)auStack_170;
    }
    else {
      bVar2 = false;
      unaff_R12 = (_Base_ptr)auStack_170;
    }
  }
  if (bVar2) {
    p_Var5 = p_Var17[1]._M_left;
    p_Stack_178 = (_Base_ptr)0x107376;
    iVar3 = ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)p_Var5);
    if ((int)this_00 == iVar3) {
      return;
    }
  }
  else {
    p_Stack_178 = (_Base_ptr)0x10738c;
    ValidateColumn();
  }
  p_Stack_178 = (_Base_ptr)0x107391;
  ValidateColumn();
  pHVar16 = (HtmlparserCppTest *)auStack_198;
  auStack_198._8_8_ = p_Var17;
  p_Stack_188 = unaff_R12;
  p_Stack_180 = this_00;
  p_Stack_178 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar2 = false;
    p_Var17 = p_Var5;
  }
  else {
    auStack_198._0_8_ = extraout_RAX_01;
    piVar8 = __errno_location();
    *piVar8 = 0;
    p_Var17 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar15)->contextMap)._M_t._M_impl;
    this_00 = (_Base_ptr)strtol((char *)p_Var17,(char **)auStack_198,10);
    puVar15 = (undefined1 *)pHVar16;
    if (*(char *)auStack_198._0_8_ == '\0') {
      bVar2 = *piVar8 == 0;
      unaff_R12 = (_Base_ptr)auStack_198;
    }
    else {
      bVar2 = false;
      unaff_R12 = (_Base_ptr)auStack_198;
    }
  }
  if (bVar2) {
    p_Var17 = p_Var5[1]._M_left;
    iVar3 = ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)p_Var17);
    if ((int)this_00 == iVar3) {
      return;
    }
  }
  else {
    ValidateValueIndex();
  }
  ValidateValueIndex();
  bVar2 = StringToBool((string *)puVar15);
  pHVar16 = (HtmlparserCppTest *)p_Var17[1]._M_left;
  iVar3 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar16);
  if (bVar2 == (iVar3 != 0)) {
    return;
  }
  ValidateIsUrlStart();
  vStack_1f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_1f8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Stack_1e0 = p_Var17;
  p_Stack_1d8 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)puVar15,"=",",",&vStack_1f8);
  if (vStack_1f8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_1f8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(pHVar16->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_1f8.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar3 = std::__cxx11::string::compare((char *)str_00);
      if (iVar3 == 0) {
        ValidateState(pHVar16,str);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)str_00);
        if (iVar3 == 0) {
          ValidateTag(pHVar16,str);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)str_00);
          if (iVar3 == 0) {
            ValidateAttribute(pHVar16,str);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)str_00);
            if (iVar3 == 0) {
              ValidateValue(pHVar16,str);
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)str_00);
              if (iVar3 == 0) {
                ValidateAttributeType(pHVar16,str);
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)str_00);
                if (iVar3 == 0) {
                  ValidateAttributeQuoted(pHVar16,str);
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar3 == 0) {
                    ValidateInJavascript(pHVar16,str);
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar3 == 0) {
                      ValidateJavascriptQuoted(pHVar16,str);
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar3 == 0) {
                        ValidateJavascriptState(pHVar16,str);
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar3 == 0) {
                          ValidateInCss(pHVar16,str);
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar3 == 0) {
                            ValidateLine(pHVar16,str);
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar3 == 0) {
                              ValidateColumn(pHVar16,str);
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar3 == 0) {
                                ValidateValueIndex(pHVar16,str);
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar3 == 0) {
                                  ValidateIsUrlStart(pHVar16,str);
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar3 == 0) {
                                    cVar9 = std::
                                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                            ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar16,str);
                                    if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
                                      this_01 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_01);
                                      ppHVar10 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar16->contextMap,str);
                                      *ppHVar10 = this_01;
                                    }
                                    ppHVar10 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar16->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar10,&pHVar16->parser_);
                                  }
                                  else {
                                    iVar3 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar3 == 0) {
                                      cVar9 = std::
                                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                              ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar16,str);
                                      if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_0010784b:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_1f8);
                                        _Unwind_Resume(extraout_RAX_02);
                                      }
                                      ppHVar10 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar16->contextMap,str);
                                      HtmlParser::CopyFrom(&pHVar16->parser_,*ppHVar10);
                                    }
                                    else {
                                      iVar3 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar3 == 0) {
                                        bVar2 = StringToBool(str);
                                        if (bVar2) {
                                          ctemplate_htmlparser::htmlparser_reset
                                                    ((pHVar16->parser_).parser_);
                                        }
                                      }
                                      else {
                                        this_02 = str_00;
                                        iVar3 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar3 == 0) {
                                          iVar3 = NameToId((HtmlparserCppTest *)this_02,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    ((pHVar16->parser_).parser_,iVar3);
                                        }
                                        else {
                                          iVar3 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar3 != 0) goto LAB_0010784b;
                                          bVar2 = StringToBool(str);
                                          if (bVar2) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      ((pHVar16->parser_).parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_1f8.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_1f8);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateAttribute(const string &expected_attr) {
  EXPECT_TRUE(parser_.attribute() != NULL);
  EXPECT_EQ(expected_attr, parser_.attribute())
      << "Unexpected attr name value at line " << parser_.line_number();
}